

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_4::Validator::BeginTryTableExpr(Validator *this,TryTableExpr *expr)

{
  SharedValidator *this_00;
  Location *loc;
  BlockDeclaration *decl;
  pointer pTVar1;
  Result RVar2;
  Type TVar3;
  TableCatch *catch_;
  pointer catch__00;
  
  this_00 = &this->validator_;
  loc = &(expr->super_ExprMixin<(wabt::ExprType)62>).super_Expr.loc;
  decl = &(expr->block).decl;
  TVar3 = GetDeclarationType(this,decl);
  RVar2 = SharedValidator::BeginTryTable(this_00,loc,TVar3);
  (this->result_).enum_ = (uint)(RVar2.enum_ == Error || (this->result_).enum_ == Error);
  pTVar1 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (catch__00 = (expr->catches).
                   super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>._M_impl.
                   super__Vector_impl_data._M_start; catch__00 != pTVar1; catch__00 = catch__00 + 1)
  {
    RVar2 = SharedValidator::OnTryTableCatch(this_00,loc,catch__00);
    (this->result_).enum_ = (uint)(RVar2.enum_ == Error || (this->result_).enum_ == Error);
  }
  TVar3 = GetDeclarationType(this,decl);
  RVar2 = SharedValidator::EndTryTable(this_00,loc,TVar3);
  (this->result_).enum_ = (uint)(RVar2.enum_ == Error || (this->result_).enum_ == Error);
  return (Result)Ok;
}

Assistant:

Result Validator::BeginTryTableExpr(TryTableExpr* expr) {
  result_ |=
      validator_.BeginTryTable(expr->loc, GetDeclarationType(expr->block.decl));
  for (const TableCatch& catch_ : expr->catches) {
    result_ |= validator_.OnTryTableCatch(expr->loc, catch_);
  }
  result_ |=
      validator_.EndTryTable(expr->loc, GetDeclarationType(expr->block.decl));
  return Result::Ok;
}